

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

lword term_absexp(void)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  lword val;
  
  val = 0;
  bVar2 = startofblock('(');
  if (bVar2 == 0) {
    val = 0;
  }
  else {
    iVar3 = parse_expr(-1,&val);
    pcVar1 = scriptname;
    if (iVar3 == 0) {
      uVar4 = getlineno();
      error(0x43,pcVar1,(ulong)uVar4);
    }
    endofblock('(',')');
  }
  return val;
}

Assistant:

static lword term_absexp(void)
{
  lword val = 0;

  if (startofblock('(')) {
    if (!parse_expr(-1,&val))
      error(67,scriptname,getlineno());  /* Absolute number expected */
    endofblock('(',')');
  }
  return val;
}